

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardView.cpp
# Opt level: O0

void __thiscall BoardView::HandleInput(BoardView *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  ulong uVar5;
  float fVar6;
  float fVar7;
  bool bVar8;
  byte bVar9;
  int iVar10;
  undefined4 extraout_var;
  element_type *peVar11;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  size_type sVar12;
  reference pvVar13;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  element_type *peVar14;
  BoardView *in_RDI;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float fVar15;
  float mwheel;
  shared_ptr<Component> *part_1;
  iterator __end10_1;
  iterator __begin10_1;
  SharedVector<Component> *__range10_1;
  shared_ptr<Component> p_1;
  iterator __end12;
  iterator __begin12;
  SharedVector<Component> *__range12;
  bool partInList;
  size_t j;
  size_t i;
  array<ImVec2,_4UL> poly;
  int hit;
  shared_ptr<Component> *part;
  iterator __end9;
  iterator __begin9;
  SharedVector<Component> *__range9;
  bool any_hits;
  shared_ptr<Component> p;
  iterator __end10;
  iterator __begin10;
  SharedVector<Component> *__range10;
  float dist;
  float dy;
  float dx;
  shared_ptr<Pin> *pin;
  iterator __end8;
  iterator __begin8;
  SharedVector<Pin> *__range8;
  shared_ptr<Pin> selection;
  float min_dist;
  ImVec2 pos;
  ImVec2 spos_1;
  ImVec2 spos;
  ImVec2 td;
  ImVec2 delta;
  ImGuiIO *io;
  int in_stack_0000326c;
  BoardView *in_stack_00003270;
  float in_stack_fffffffffffff948;
  float in_stack_fffffffffffff94c;
  ImGuiMouseButton in_stack_fffffffffffff950;
  ImGuiMouseButton in_stack_fffffffffffff954;
  undefined1 value;
  value_type *in_stack_fffffffffffff958;
  Confparse *in_stack_fffffffffffff960;
  int in_stack_fffffffffffff968;
  int in_stack_fffffffffffff96c;
  BoardView *in_stack_fffffffffffff970;
  string *name;
  KeyBindings *in_stack_fffffffffffff978;
  KeyBindings *this_00;
  undefined4 in_stack_fffffffffffff980;
  float in_stack_fffffffffffff984;
  uint uVar16;
  char *in_stack_fffffffffffff988;
  KeyBindings *__s;
  BoardView *in_stack_fffffffffffff990;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  BoardView *in_stack_fffffffffffff9a8;
  BoardView *in_stack_fffffffffffffa50;
  allocator<char> local_459;
  string local_458 [39];
  undefined1 local_431 [40];
  undefined1 local_409 [40];
  allocator<char> local_3e1;
  string local_3e0 [39];
  allocator<char> local_3b9;
  string local_3b8 [39];
  allocator<char> local_391;
  string local_390 [39];
  allocator<char> local_369;
  string local_368 [39];
  allocator<char> local_341;
  string local_340 [39];
  allocator<char> local_319;
  string local_318 [39];
  allocator<char> local_2f1;
  string local_2f0 [39];
  allocator<char> local_2c9;
  string local_2c8 [39];
  allocator<char> local_2a1;
  string local_2a0 [39];
  allocator<char> local_279;
  string local_278 [39];
  allocator<char> local_251;
  string local_250 [39];
  allocator<char> local_229;
  string local_228 [39];
  allocator<char> local_201;
  string local_200 [39];
  allocator<char> local_1d9;
  string local_1d8 [39];
  allocator<char> local_1b1;
  string local_1b0 [36];
  float local_18c;
  reference local_188;
  shared_ptr<Component> *local_180;
  __normal_iterator<std::shared_ptr<Component>_*,_std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>_>
  local_178;
  undefined8 local_170;
  shared_ptr<Component> *local_158;
  __normal_iterator<std::shared_ptr<Component>_*,_std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>_>
  local_150;
  undefined8 local_148;
  byte local_139;
  ulong local_138;
  ulong local_130;
  array<ImVec2,_4UL> local_128;
  uint local_f4;
  reference local_f0;
  shared_ptr<Component> *local_e8;
  __normal_iterator<std::shared_ptr<Component>_*,_std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>_>
  local_e0;
  undefined8 local_d8;
  byte local_c9;
  shared_ptr<Component> *local_b8;
  __normal_iterator<std::shared_ptr<Component>_*,_std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>_>
  local_b0;
  undefined8 local_a8;
  float local_9c;
  float local_98;
  float local_94;
  reference local_80;
  shared_ptr<Pin> *local_78;
  __normal_iterator<std::shared_ptr<Pin>_*,_std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>_>
  local_70 [3];
  undefined8 local_58;
  float local_3c;
  ImVec2 local_38;
  ImVec2 local_30;
  ImVec2 local_28;
  ImVec2 local_20;
  ImVec2 local_18;
  ImGuiIO *local_10;
  
  if ((in_RDI->m_board != (Board *)0x0) && (in_RDI->m_file != (BRDFileBase *)0x0)) {
    local_10 = ImGui::GetIO();
    bVar8 = ImGui::IsWindowHovered((ImGuiHoveredFlags)in_stack_fffffffffffff960);
    if (bVar8) {
      bVar8 = ImGui::IsWindowFocused((ImGuiFocusedFlags)in_stack_fffffffffffff960);
      if (!bVar8) {
        ImGui::FocusWindow((ImGuiWindow *)in_stack_fffffffffffff990,
                           (ImGuiFocusRequestFlags)((ulong)in_stack_fffffffffffff988 >> 0x20));
      }
      bVar8 = ImGui::IsMouseDragging(in_stack_fffffffffffff950,in_stack_fffffffffffff94c);
      if (bVar8) {
        if ((in_RDI->m_dragging_token == 0) &&
           (local_10->MouseClickedPos[0].x < (in_RDI->m_board_surface).x)) {
          in_RDI->m_dragging_token = 1;
        }
        if (in_RDI->m_dragging_token == 1) {
          iVar10 = 0;
          local_18 = ImGui::GetMouseDragDelta
                               ((ImGuiMouseButton)in_stack_fffffffffffff94c,
                                in_stack_fffffffffffff948);
          std::abs(iVar10);
          if ((500.0 < extraout_XMM0_Da) || (std::abs(iVar10), 500.0 < extraout_XMM0_Da_00)) {
            local_18.x = 0.0;
            local_18.y = 0.0;
          }
          ImGui::ResetMouseDragDelta(0);
          local_20 = ScreenToCoord((BoardView *)
                                   CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968),
                                   (float)((ulong)in_stack_fffffffffffff960 >> 0x20),
                                   SUB84(in_stack_fffffffffffff960,0),
                                   (float)((ulong)in_stack_fffffffffffff958 >> 0x20));
          in_RDI->m_dx = local_20.x + in_RDI->m_dx;
          in_RDI->m_dy = local_20.y + in_RDI->m_dy;
          in_RDI->m_draggingLastFrame = true;
          in_RDI->m_needsRedraw = true;
        }
      }
      else if (-1 < in_RDI->m_dragging_token) {
        in_RDI->m_dragging_token = 0;
        if ((in_RDI->m_lastFileOpenWasInvalid & 1U) == 0) {
          if (((((in_RDI->m_lastFileOpenWasInvalid & 1U) == 0) &&
               (in_RDI->m_file != (BRDFileBase *)0x0)) && (in_RDI->m_board != (Board *)0x0)) &&
             (bVar8 = ImGui::IsMouseClicked(0,false), bVar8)) {
            if (((in_RDI->config).showAnnotations & 1U) != 0) {
              local_28 = ImGui::GetMousePos();
              iVar10 = AnnotationIsHovered(in_stack_fffffffffffff9a8);
              if (iVar10 != 0) {
                in_RDI->m_annotation_clicked_id = in_RDI->m_annotation_last_hovered;
              }
              in_RDI->m_annotationedit_retain = false;
              in_RDI->m_showContextMenu = true;
              in_RDI->m_showContextMenuPos = local_28;
              in_RDI->m_needsRedraw = true;
              if ((in_RDI->debug & 1U) != 0) {
                fprintf(_stderr,"context click request at (%f %f)\n",(double)local_28.x);
              }
            }
          }
          else if ((((in_RDI->m_lastFileOpenWasInvalid & 1U) == 0) &&
                   (in_RDI->m_file != (BRDFileBase *)0x0)) &&
                  ((in_RDI->m_board != (Board *)0x0 &&
                   (bVar8 = ImGui::IsMouseReleased(in_stack_fffffffffffff954), bVar8)))) {
            FlipBoard(in_stack_00003270,in_stack_0000326c);
          }
          else if ((((in_RDI->m_lastFileOpenWasInvalid & 1U) == 0) &&
                   (in_RDI->m_file != (BRDFileBase *)0x0)) &&
                  ((in_RDI->m_board != (Board *)0x0 &&
                   ((bVar8 = ImGui::IsMouseReleased(in_stack_fffffffffffff954), bVar8 &&
                    ((in_RDI->m_draggingLastFrame & 1U) == 0)))))) {
            local_30 = ImGui::GetMousePos();
            local_38 = ScreenToCoord((BoardView *)
                                     CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968),
                                     (float)((ulong)in_stack_fffffffffffff960 >> 0x20),
                                     SUB84(in_stack_fffffffffffff960,0),
                                     (float)((ulong)in_stack_fffffffffffff958 >> 0x20));
            in_RDI->m_needsRedraw = true;
            local_3c = (float)in_RDI->m_pinDiameter * 0.5;
            local_3c = local_3c * local_3c;
            std::shared_ptr<Pin>::shared_ptr
                      ((shared_ptr<Pin> *)
                       CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
                       (nullptr_t)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948));
            iVar10 = (*in_RDI->m_board->_vptr_Board[4])();
            local_58 = CONCAT44(extraout_var,iVar10);
            local_70[0]._M_current =
                 (shared_ptr<Pin> *)
                 std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>::begin
                           ((vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_> *)
                            CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948));
            local_78 = (shared_ptr<Pin> *)
                       std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>::
                       end((vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_> *)
                           CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948));
            while (bVar8 = __gnu_cxx::operator!=
                                     ((__normal_iterator<std::shared_ptr<Pin>_*,_std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>_>
                                       *)CONCAT44(in_stack_fffffffffffff954,
                                                  in_stack_fffffffffffff950),
                                      (__normal_iterator<std::shared_ptr<Pin>_*,_std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>_>
                                       *)CONCAT44(in_stack_fffffffffffff94c,
                                                  in_stack_fffffffffffff948)), bVar8) {
              local_80 = __gnu_cxx::
                         __normal_iterator<std::shared_ptr<Pin>_*,_std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>_>
                         ::operator*(local_70);
              std::shared_ptr<BoardElement>::shared_ptr<Pin,void>
                        ((shared_ptr<BoardElement> *)
                         CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
                         (shared_ptr<Pin> *)
                         CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948));
              bVar8 = BoardElementIsVisible
                                ((BoardView *)
                                 CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968),
                                 (shared_ptr<BoardElement> *)in_stack_fffffffffffff960);
              std::shared_ptr<BoardElement>::~shared_ptr((shared_ptr<BoardElement> *)0x129300);
              if (bVar8) {
                peVar11 = std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                          operator->((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)0x12931d);
                local_94 = (peVar11->position).x - local_38.x;
                peVar11 = std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                          operator->((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)0x129341);
                local_98 = (peVar11->position).y - local_38.y;
                fVar15 = local_94 * local_94 + local_98 * local_98;
                local_9c = fVar15;
                peVar11 = std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                          operator->((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)0x1293ac);
                fVar1 = peVar11->diameter;
                peVar11 = std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                          operator->((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)0x1293c7);
                if ((fVar15 < fVar1 * peVar11->diameter) && (local_9c < local_3c)) {
                  std::shared_ptr<Pin>::operator=
                            ((shared_ptr<Pin> *)
                             CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
                             (shared_ptr<Pin> *)
                             CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948));
                  local_3c = local_9c;
                }
              }
              __gnu_cxx::
              __normal_iterator<std::shared_ptr<Pin>_*,_std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>_>
              ::operator++(local_70);
            }
            std::shared_ptr<Pin>::operator=
                      ((shared_ptr<Pin> *)
                       CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
                       (shared_ptr<Pin> *)
                       CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948));
            bVar8 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&in_RDI->m_pinSelected)
            ;
            if (bVar8) {
              if ((local_10->KeyCtrl & 1U) == 0) {
                iVar10 = (*in_RDI->m_board->_vptr_Board[3])();
                local_a8 = CONCAT44(extraout_var_00,iVar10);
                local_b0._M_current =
                     (shared_ptr<Component> *)
                     std::
                     vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                     ::begin((vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                              *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948));
                local_b8 = (shared_ptr<Component> *)
                           std::
                           vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                           ::end((vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                                  *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948));
                while (bVar8 = __gnu_cxx::operator!=
                                         ((__normal_iterator<std::shared_ptr<Component>_*,_std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>_>
                                           *)CONCAT44(in_stack_fffffffffffff954,
                                                      in_stack_fffffffffffff950),
                                          (__normal_iterator<std::shared_ptr<Component>_*,_std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>_>
                                           *)CONCAT44(in_stack_fffffffffffff94c,
                                                      in_stack_fffffffffffff948)), bVar8) {
                  __gnu_cxx::
                  __normal_iterator<std::shared_ptr<Component>_*,_std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>_>
                  ::operator*(&local_b0);
                  std::shared_ptr<Component>::shared_ptr
                            ((shared_ptr<Component> *)
                             CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
                             (shared_ptr<Component> *)
                             CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948));
                  std::__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x129564);
                  peVar14 = std::
                            __shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            ::operator->((__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                          *)0x129571);
                  peVar14->visualmode = '\0';
                  std::shared_ptr<Component>::~shared_ptr((shared_ptr<Component> *)0x129585);
                  __gnu_cxx::
                  __normal_iterator<std::shared_ptr<Component>_*,_std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>_>
                  ::operator++(&local_b0);
                }
                std::
                vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::
                resize((vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                        *)in_stack_fffffffffffff970,
                       CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968));
                std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>::resize
                          ((vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_> *)
                           in_stack_fffffffffffff970,
                           CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968));
              }
              std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                        ((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                         0x1295e6);
              std::__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                         )0x1295f2);
              std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                        ((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                         0x1295ff);
              peVar14 = std::
                        __shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                        operator->((__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x12960b);
              peVar14->visualmode = '\x01';
              std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                        ((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                         0x129638);
              std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
              ::push_back((vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                           *)in_stack_fffffffffffff960,in_stack_fffffffffffff958);
            }
            bVar8 = std::operator==((shared_ptr<Pin> *)
                                    CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
                                    (nullptr_t)
                                    CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948));
            if (bVar8) {
              local_c9 = 0;
              iVar10 = (*in_RDI->m_board->_vptr_Board[3])();
              local_d8 = CONCAT44(extraout_var_01,iVar10);
              local_e0._M_current =
                   (shared_ptr<Component> *)
                   std::
                   vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                   ::begin((vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                            *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948));
              local_e8 = (shared_ptr<Component> *)
                         std::
                         vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                         ::end((vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                                *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948));
              while (bVar8 = __gnu_cxx::operator!=
                                       ((__normal_iterator<std::shared_ptr<Component>_*,_std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>_>
                                         *)CONCAT44(in_stack_fffffffffffff954,
                                                    in_stack_fffffffffffff950),
                                        (__normal_iterator<std::shared_ptr<Component>_*,_std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>_>
                                         *)CONCAT44(in_stack_fffffffffffff94c,
                                                    in_stack_fffffffffffff948)), bVar8) {
                local_f0 = __gnu_cxx::
                           __normal_iterator<std::shared_ptr<Component>_*,_std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>_>
                           ::operator*(&local_e0);
                local_f4 = 0;
                std::shared_ptr<BoardElement>::shared_ptr<Component,void>
                          ((shared_ptr<BoardElement> *)
                           CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
                           (shared_ptr<Component> *)
                           CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948));
                bVar8 = BoardElementIsVisible
                                  ((BoardView *)
                                   CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968),
                                   (shared_ptr<BoardElement> *)in_stack_fffffffffffff960);
                std::shared_ptr<BoardElement>::~shared_ptr((shared_ptr<BoardElement> *)0x129768);
                if (((bVar8 ^ 0xffU) & 1) == 0) {
                  peVar14 = std::
                            __shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            ::operator->((__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                          *)0x1297ad);
                  local_128._M_elems[0] = (peVar14->outline)._M_elems[0];
                  local_128._M_elems[1] = (peVar14->outline)._M_elems[1];
                  local_128._M_elems[2] = (peVar14->outline)._M_elems[2];
                  local_128._M_elems[3] = (peVar14->outline)._M_elems[3];
                  local_130 = 0;
                  sVar12 = std::array<ImVec2,_4UL>::size(&local_128);
                  local_138 = sVar12 - 1;
                  for (; uVar5 = local_130, sVar12 = std::array<ImVec2,_4UL>::size(&local_128),
                      uVar5 < sVar12; local_130 = local_130 + 1) {
                    pvVar13 = std::array<ImVec2,_4UL>::operator[]
                                        ((array<ImVec2,_4UL> *)
                                         CONCAT44(in_stack_fffffffffffff954,
                                                  in_stack_fffffffffffff950),
                                         CONCAT44(in_stack_fffffffffffff94c,
                                                  in_stack_fffffffffffff948));
                    bVar8 = local_38.y < pvVar13->y;
                    pvVar13 = std::array<ImVec2,_4UL>::operator[]
                                        ((array<ImVec2,_4UL> *)
                                         CONCAT44(in_stack_fffffffffffff954,
                                                  in_stack_fffffffffffff950),
                                         CONCAT44(in_stack_fffffffffffff94c,
                                                  in_stack_fffffffffffff948));
                    if (bVar8 != local_38.y < pvVar13->y) {
                      fVar6 = local_38.x;
                      pvVar13 = std::array<ImVec2,_4UL>::operator[]
                                          ((array<ImVec2,_4UL> *)
                                           CONCAT44(in_stack_fffffffffffff954,
                                                    in_stack_fffffffffffff950),
                                           CONCAT44(in_stack_fffffffffffff94c,
                                                    in_stack_fffffffffffff948));
                      fVar1 = pvVar13->x;
                      pvVar13 = std::array<ImVec2,_4UL>::operator[]
                                          ((array<ImVec2,_4UL> *)
                                           CONCAT44(in_stack_fffffffffffff954,
                                                    in_stack_fffffffffffff950),
                                           CONCAT44(in_stack_fffffffffffff94c,
                                                    in_stack_fffffffffffff948));
                      fVar15 = pvVar13->x;
                      fVar7 = local_38.y;
                      pvVar13 = std::array<ImVec2,_4UL>::operator[]
                                          ((array<ImVec2,_4UL> *)
                                           CONCAT44(in_stack_fffffffffffff954,
                                                    in_stack_fffffffffffff950),
                                           CONCAT44(in_stack_fffffffffffff94c,
                                                    in_stack_fffffffffffff948));
                      fVar2 = pvVar13->y;
                      pvVar13 = std::array<ImVec2,_4UL>::operator[]
                                          ((array<ImVec2,_4UL> *)
                                           CONCAT44(in_stack_fffffffffffff954,
                                                    in_stack_fffffffffffff950),
                                           CONCAT44(in_stack_fffffffffffff94c,
                                                    in_stack_fffffffffffff948));
                      fVar3 = pvVar13->y;
                      pvVar13 = std::array<ImVec2,_4UL>::operator[]
                                          ((array<ImVec2,_4UL> *)
                                           CONCAT44(in_stack_fffffffffffff954,
                                                    in_stack_fffffffffffff950),
                                           CONCAT44(in_stack_fffffffffffff94c,
                                                    in_stack_fffffffffffff948));
                      fVar4 = pvVar13->y;
                      pvVar13 = std::array<ImVec2,_4UL>::operator[]
                                          ((array<ImVec2,_4UL> *)
                                           CONCAT44(in_stack_fffffffffffff954,
                                                    in_stack_fffffffffffff950),
                                           CONCAT44(in_stack_fffffffffffff94c,
                                                    in_stack_fffffffffffff948));
                      if (fVar6 < ((fVar1 - fVar15) * (fVar7 - fVar2)) / (fVar3 - fVar4) +
                                  pvVar13->x) {
                        local_f4 = local_f4 ^ 1;
                      }
                    }
                    local_138 = local_130;
                  }
                  if (local_f4 != 0) {
                    local_c9 = 1;
                    local_139 = contains<std::shared_ptr<Component>>
                                          ((shared_ptr<Component> *)in_stack_fffffffffffff970,
                                           (vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                                            *)CONCAT44(in_stack_fffffffffffff96c,
                                                       in_stack_fffffffffffff968));
                    if ((local_10->KeyCtrl & 1U) == 0) {
                      iVar10 = (*in_RDI->m_board->_vptr_Board[3])();
                      local_148 = CONCAT44(extraout_var_02,iVar10);
                      local_150._M_current =
                           (shared_ptr<Component> *)
                           std::
                           vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                           ::begin((vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                                    *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948))
                      ;
                      local_158 = (shared_ptr<Component> *)
                                  std::
                                  vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                                  ::end((vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                                         *)CONCAT44(in_stack_fffffffffffff94c,
                                                    in_stack_fffffffffffff948));
                      while (bVar8 = __gnu_cxx::operator!=
                                               ((__normal_iterator<std::shared_ptr<Component>_*,_std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>_>
                                                 *)CONCAT44(in_stack_fffffffffffff954,
                                                            in_stack_fffffffffffff950),
                                                (__normal_iterator<std::shared_ptr<Component>_*,_std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>_>
                                                 *)CONCAT44(in_stack_fffffffffffff94c,
                                                            in_stack_fffffffffffff948)), bVar8) {
                        __gnu_cxx::
                        __normal_iterator<std::shared_ptr<Component>_*,_std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>_>
                        ::operator*(&local_150);
                        std::shared_ptr<Component>::shared_ptr
                                  ((shared_ptr<Component> *)
                                   CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
                                   (shared_ptr<Component> *)
                                   CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948));
                        std::
                        __shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                        operator->((__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x129ba1);
                        peVar14 = std::
                                  __shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  ::operator->((__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                *)0x129bae);
                        peVar14->visualmode = '\0';
                        std::shared_ptr<Component>::~shared_ptr((shared_ptr<Component> *)0x129bc2);
                        __gnu_cxx::
                        __normal_iterator<std::shared_ptr<Component>_*,_std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>_>
                        ::operator++(&local_150);
                      }
                      std::
                      vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                      ::resize((vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                                *)in_stack_fffffffffffff970,
                               CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968));
                      std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>::
                      resize((vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_> *
                             )in_stack_fffffffffffff970,
                             CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968));
                      if ((local_139 & 1) == 0) {
                        std::
                        vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                        ::push_back((vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                                     *)in_stack_fffffffffffff960,in_stack_fffffffffffff958);
                        std::
                        __shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                        operator->((__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x129c3a);
                        peVar14 = std::
                                  __shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  ::operator->((__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                *)0x129c47);
                        peVar14->visualmode = '\x01';
                      }
                    }
                    else if ((bool)local_139) {
                      remove<std::shared_ptr<Component>>
                                ((shared_ptr<Component> *)in_stack_fffffffffffff970,
                                 (vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                                  *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968));
                      std::__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x129aea);
                      peVar14 = std::
                                __shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                ::operator->((__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                              *)0x129af7);
                      peVar14->visualmode = '\0';
                    }
                    else {
                      std::
                      vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                      ::push_back((vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                                   *)in_stack_fffffffffffff960,in_stack_fffffffffffff958);
                      std::__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x129aa9);
                      peVar14 = std::
                                __shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                ::operator->((__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                              *)0x129ab6);
                      peVar14->visualmode = '\x01';
                    }
                  }
                }
                __gnu_cxx::
                __normal_iterator<std::shared_ptr<Component>_*,_std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>_>
                ::operator++(&local_e0);
              }
              if (((local_c9 & 1) == 0) && ((local_10->KeyCtrl & 1U) == 0)) {
                iVar10 = (*in_RDI->m_board->_vptr_Board[3])();
                local_170 = CONCAT44(extraout_var_03,iVar10);
                local_178._M_current =
                     (shared_ptr<Component> *)
                     std::
                     vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                     ::begin((vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                              *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948));
                local_180 = (shared_ptr<Component> *)
                            std::
                            vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                            ::end((vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                                   *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948));
                while (bVar8 = __gnu_cxx::operator!=
                                         ((__normal_iterator<std::shared_ptr<Component>_*,_std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>_>
                                           *)CONCAT44(in_stack_fffffffffffff954,
                                                      in_stack_fffffffffffff950),
                                          (__normal_iterator<std::shared_ptr<Component>_*,_std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>_>
                                           *)CONCAT44(in_stack_fffffffffffff94c,
                                                      in_stack_fffffffffffff948)), bVar8) {
                  local_188 = __gnu_cxx::
                              __normal_iterator<std::shared_ptr<Component>_*,_std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>_>
                              ::operator*(&local_178);
                  std::__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x129d1f);
                  peVar14 = std::
                            __shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            ::operator->((__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                          *)0x129d2c);
                  peVar14->visualmode = '\0';
                  __gnu_cxx::
                  __normal_iterator<std::shared_ptr<Component>_*,_std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>_>
                  ::operator++(&local_178);
                }
                std::
                vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::
                clear((vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                       *)0x129d56);
              }
            }
            std::shared_ptr<Pin>::~shared_ptr((shared_ptr<Pin> *)0x129d65);
          }
          else if ((in_RDI->m_showContextMenu & 1U) == 0) {
            iVar10 = AnnotationIsHovered(in_stack_fffffffffffff9a8);
            if (iVar10 == 0) {
              in_RDI->AnnotationWasHovered = false;
              in_RDI->m_needsRedraw = true;
            }
            else {
              in_RDI->m_needsRedraw = true;
              in_RDI->AnnotationWasHovered = true;
            }
          }
          in_RDI->m_draggingLastFrame = false;
        }
        local_18c = local_10->MouseWheel;
        if ((local_18c != 0.0) || (NAN(local_18c))) {
          local_18c = (in_RDI->config).zoomFactor * local_18c;
          Zoom(in_stack_fffffffffffff990,(float)((ulong)in_stack_fffffffffffff988 >> 0x20),
               SUB84(in_stack_fffffffffffff988,0),in_stack_fffffffffffff984);
        }
      }
    }
    value = (undefined1)((uint)in_stack_fffffffffffff954 >> 0x18);
    if ((local_10->WantCaptureKeyboard & 1U) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff990,in_stack_fffffffffffff988,
                 (allocator<char> *)CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980));
      bVar8 = KeyBindings::isPressed(in_stack_fffffffffffff978,(string *)in_stack_fffffffffffff970);
      std::__cxx11::string::~string(local_1b0);
      std::allocator<char>::~allocator(&local_1b1);
      if (bVar8) {
        Mirror(in_stack_fffffffffffffa50);
        CenterView(in_stack_fffffffffffff970);
        in_RDI->m_needsRedraw = true;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff990,in_stack_fffffffffffff988,
                   (allocator<char> *)CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980))
        ;
        bVar8 = KeyBindings::isPressed
                          (in_stack_fffffffffffff978,(string *)in_stack_fffffffffffff970);
        std::__cxx11::string::~string(local_1d8);
        std::allocator<char>::~allocator(&local_1d9);
        if (bVar8) {
          Rotate(in_RDI,1);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff990,in_stack_fffffffffffff988,
                     (allocator<char> *)
                     CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980));
          bVar8 = KeyBindings::isPressed
                            (in_stack_fffffffffffff978,(string *)in_stack_fffffffffffff970);
          std::__cxx11::string::~string(local_200);
          std::allocator<char>::~allocator(&local_201);
          if (bVar8) {
            Rotate(in_RDI,-1);
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff990,in_stack_fffffffffffff988,
                       (allocator<char> *)
                       CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980));
            bVar8 = KeyBindings::isPressed
                              (in_stack_fffffffffffff978,(string *)in_stack_fffffffffffff970);
            std::__cxx11::string::~string(local_228);
            std::allocator<char>::~allocator(&local_229);
            if (bVar8) {
              Zoom(in_stack_fffffffffffff990,(float)((ulong)in_stack_fffffffffffff988 >> 0x20),
                   SUB84(in_stack_fffffffffffff988,0),in_stack_fffffffffffff984);
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff990,in_stack_fffffffffffff988,
                         (allocator<char> *)
                         CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980));
              bVar8 = KeyBindings::isPressed
                                (in_stack_fffffffffffff978,(string *)in_stack_fffffffffffff970);
              std::__cxx11::string::~string(local_250);
              std::allocator<char>::~allocator(&local_251);
              if (bVar8) {
                Zoom(in_stack_fffffffffffff990,(float)((ulong)in_stack_fffffffffffff988 >> 0x20),
                     SUB84(in_stack_fffffffffffff988,0),in_stack_fffffffffffff984);
              }
              else {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff990,in_stack_fffffffffffff988,
                           (allocator<char> *)
                           CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980));
                bVar8 = KeyBindings::isPressed
                                  (in_stack_fffffffffffff978,(string *)in_stack_fffffffffffff970);
                std::__cxx11::string::~string(local_278);
                std::allocator<char>::~allocator(&local_279);
                if (bVar8) {
                  DPI((in_RDI->config).panFactor);
                  Pan(in_stack_fffffffffffff970,in_stack_fffffffffffff96c,in_stack_fffffffffffff968)
                  ;
                }
                else {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffff990,in_stack_fffffffffffff988,
                             (allocator<char> *)
                             CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980));
                  bVar8 = KeyBindings::isPressed
                                    (in_stack_fffffffffffff978,(string *)in_stack_fffffffffffff970);
                  std::__cxx11::string::~string(local_2a0);
                  std::allocator<char>::~allocator(&local_2a1);
                  if (bVar8) {
                    DPI((in_RDI->config).panFactor);
                    Pan(in_stack_fffffffffffff970,in_stack_fffffffffffff96c,
                        in_stack_fffffffffffff968);
                  }
                  else {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffff990,in_stack_fffffffffffff988,
                               (allocator<char> *)
                               CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980));
                    bVar8 = KeyBindings::isPressed
                                      (in_stack_fffffffffffff978,(string *)in_stack_fffffffffffff970
                                      );
                    std::__cxx11::string::~string(local_2c8);
                    std::allocator<char>::~allocator(&local_2c9);
                    if (bVar8) {
                      DPI((in_RDI->config).panFactor);
                      Pan(in_stack_fffffffffffff970,in_stack_fffffffffffff96c,
                          in_stack_fffffffffffff968);
                    }
                    else {
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff990,in_stack_fffffffffffff988,
                                 (allocator<char> *)
                                 CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980));
                      bVar8 = KeyBindings::isPressed
                                        (in_stack_fffffffffffff978,
                                         (string *)in_stack_fffffffffffff970);
                      std::__cxx11::string::~string(local_2f0);
                      std::allocator<char>::~allocator(&local_2f1);
                      if (bVar8) {
                        DPI((in_RDI->config).panFactor);
                        Pan(in_stack_fffffffffffff970,in_stack_fffffffffffff96c,
                            in_stack_fffffffffffff968);
                      }
                      else {
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)in_stack_fffffffffffff990,in_stack_fffffffffffff988,
                                   (allocator<char> *)
                                   CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980));
                        bVar8 = KeyBindings::isPressed
                                          (in_stack_fffffffffffff978,
                                           (string *)in_stack_fffffffffffff970);
                        std::__cxx11::string::~string(local_318);
                        std::allocator<char>::~allocator(&local_319);
                        if (bVar8) {
                          CenterView(in_stack_fffffffffffff970);
                        }
                        else {
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)in_stack_fffffffffffff990,in_stack_fffffffffffff988,
                                     (allocator<char> *)
                                     CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980));
                          bVar8 = KeyBindings::isPressed
                                            (in_stack_fffffffffffff978,
                                             (string *)in_stack_fffffffffffff970);
                          std::__cxx11::string::~string(local_340);
                          std::allocator<char>::~allocator(&local_341);
                          if (bVar8) {
                            in_RDI->m_wantsQuit = true;
                          }
                          else {
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_fffffffffffff990,in_stack_fffffffffffff988,
                                       (allocator<char> *)
                                       CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980)
                                      );
                            bVar8 = KeyBindings::isPressed
                                              (in_stack_fffffffffffff978,
                                               (string *)in_stack_fffffffffffff970);
                            std::__cxx11::string::~string(local_368);
                            std::allocator<char>::~allocator(&local_369);
                            if (bVar8) {
                              (in_RDI->config).showInfoPanel =
                                   (bool)(~(in_RDI->config).showInfoPanel & 1);
                              Confparse::WriteBool
                                        (in_stack_fffffffffffff960,(char *)in_stack_fffffffffffff958
                                         ,(bool)value);
                            }
                            else {
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)in_stack_fffffffffffff990,in_stack_fffffffffffff988,
                                         (allocator<char> *)
                                         CONCAT44(in_stack_fffffffffffff984,
                                                  in_stack_fffffffffffff980));
                              bVar8 = KeyBindings::isPressed
                                                (in_stack_fffffffffffff978,
                                                 (string *)in_stack_fffffffffffff970);
                              std::__cxx11::string::~string(local_390);
                              std::allocator<char>::~allocator(&local_391);
                              if (bVar8) {
                                in_RDI->m_showNetList = (bool)((in_RDI->m_showNetList & 1U) - 1 & 1)
                                ;
                              }
                              else {
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)in_stack_fffffffffffff990,in_stack_fffffffffffff988,
                                           (allocator<char> *)
                                           CONCAT44(in_stack_fffffffffffff984,
                                                    in_stack_fffffffffffff980));
                                bVar8 = KeyBindings::isPressed
                                                  (in_stack_fffffffffffff978,
                                                   (string *)in_stack_fffffffffffff970);
                                std::__cxx11::string::~string(local_3b8);
                                std::allocator<char>::~allocator(&local_3b9);
                                if (bVar8) {
                                  in_RDI->m_showPartList =
                                       (bool)((in_RDI->m_showPartList & 1U) - 1 & 1);
                                }
                                else {
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)in_stack_fffffffffffff990,in_stack_fffffffffffff988,
                                             (allocator<char> *)
                                             CONCAT44(in_stack_fffffffffffff984,
                                                      in_stack_fffffffffffff980));
                                  bVar8 = KeyBindings::isPressed
                                                    (in_stack_fffffffffffff978,
                                                     (string *)in_stack_fffffffffffff970);
                                  std::__cxx11::string::~string(local_3e0);
                                  std::allocator<char>::~allocator(&local_3e1);
                                  if (bVar8) {
                                    FlipBoard(in_stack_00003270,in_stack_0000326c);
                                  }
                                  else {
                                    __s = &in_RDI->keybindings;
                                    this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)local_409;
                                    std::allocator<char>::allocator();
                                    std::__cxx11::string::string<std::allocator<char>>
                                              (this_01,(char *)__s,
                                               (allocator<char> *)
                                               CONCAT44(in_stack_fffffffffffff984,
                                                        in_stack_fffffffffffff980));
                                    bVar8 = KeyBindings::isPressed
                                                      (in_stack_fffffffffffff978,
                                                       (string *)in_stack_fffffffffffff970);
                                    uVar16 = CONCAT13(bVar8,SUB43(in_stack_fffffffffffff984,0));
                                    std::__cxx11::string::~string((string *)(local_409 + 1));
                                    std::allocator<char>::~allocator((allocator<char> *)local_409);
                                    if ((uVar16 & 0x1000000) == 0) {
                                      name = (string *)&in_RDI->keybindings;
                                      this_00 = (KeyBindings *)local_431;
                                      std::allocator<char>::allocator();
                                      std::__cxx11::string::string<std::allocator<char>>
                                                (this_01,(char *)__s,
                                                 (allocator<char> *)
                                                 CONCAT44(uVar16,in_stack_fffffffffffff980));
                                      bVar9 = KeyBindings::isPressed(this_00,name);
                                      std::__cxx11::string::~string((string *)(local_431 + 1));
                                      std::allocator<char>::~allocator((allocator<char> *)local_431)
                                      ;
                                      if ((bVar9 & 1) == 0) {
                                        std::allocator<char>::allocator();
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  (this_01,(char *)__s,
                                                   (allocator<char> *)
                                                   CONCAT44(uVar16,in_stack_fffffffffffff980));
                                        bVar9 = KeyBindings::isPressed(this_00,name);
                                        std::__cxx11::string::~string(local_458);
                                        std::allocator<char>::~allocator(&local_459);
                                        if ((bVar9 & 1) != 0) {
                                          ClearAllHighlights((BoardView *)
                                                             CONCAT44(uVar16,
                                                  in_stack_fffffffffffff980));
                                        }
                                      }
                                      else if ((in_RDI->m_validBoard & 1U) != 0) {
                                        in_RDI->m_showSearch = true;
                                        in_RDI->m_needsRedraw = true;
                                      }
                                    }
                                    else {
                                      (in_RDI->config).showPins =
                                           ((in_RDI->config).showPins & 1U) != 1;
                                      in_RDI->m_needsRedraw = true;
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void BoardView::HandleInput() {
	if (!m_board || (!m_file)) return;

	const ImGuiIO &io = ImGui::GetIO();

	if (ImGui::IsWindowHovered()) {
		if (!ImGui::IsWindowFocused()) {
			// Set focus on boardview area hover to apply our key bindings instead of the currently active ImGui's keyboard navigation
			// Using imgui_internal's FocusWindow with UnlessBelowModal instead of SetWindowFocus
			// Otherwise PopupModal get closed right after opening when boardview area is hovered
			// https://github.com/ocornut/imgui/issues/3595
			// Warning: wouldn't work with regular Popup but we use only PopupModal
			ImGui::FocusWindow(nullptr, ImGuiFocusRequestFlags_UnlessBelowModal);
		}

		if (ImGui::IsMouseDragging(0)) {
			if ((m_dragging_token == 0) && (io.MouseClickedPos[0].x < m_board_surface.x)) m_dragging_token = 1; // own it.
			if (m_dragging_token == 1) {
				//		   if ((io.MouseClickedPos[0].x < m_info_surface.x)) {
				ImVec2 delta = ImGui::GetMouseDragDelta();
				if ((abs(delta.x) > 500) || (abs(delta.y) > 500)) {
					delta.x = 0;
					delta.y = 0;
				} // If the delta values are crazy just drop them (happens when panning
				// off screen). 500 arbritary chosen
				ImGui::ResetMouseDragDelta();
				ImVec2 td = ScreenToCoord(delta.x, delta.y, 0);
				m_dx += td.x;
				m_dy += td.y;
				m_draggingLastFrame = true;
				m_needsRedraw       = true;
			}
		} else if (m_dragging_token >= 0) {
			m_dragging_token = 0;

			if (m_lastFileOpenWasInvalid == false) {
				// Conext menu
				if (!m_lastFileOpenWasInvalid && m_file && m_board && ImGui::IsMouseClicked(1)) {
					if (config.showAnnotations) {
						// Build context menu here, for annotations and inspection
						//
						ImVec2 spos = ImGui::GetMousePos();
						if (AnnotationIsHovered()) m_annotation_clicked_id = m_annotation_last_hovered;

						m_annotationedit_retain = false;
						m_showContextMenu       = true;
						m_showContextMenuPos    = spos;
						m_needsRedraw           = true;
						if (debug) fprintf(stderr, "context click request at (%f %f)\n", spos.x, spos.y);
					}

					// Flip the board with the middle click
				} else if (!m_lastFileOpenWasInvalid && m_file && m_board && ImGui::IsMouseReleased(2)) {
					FlipBoard();

					// Else, click to select pin
				} else if (!m_lastFileOpenWasInvalid && m_file && m_board && ImGui::IsMouseReleased(0) && !m_draggingLastFrame) {
					ImVec2 spos = ImGui::GetMousePos();
					ImVec2 pos  = ScreenToCoord(spos.x, spos.y);

					m_needsRedraw = true;

					// threshold to within a pin's diameter of the pin center
					// float min_dist = m_pinDiameter * 1.0f;
					float min_dist = m_pinDiameter / 2.0f;
					min_dist *= min_dist; // all distance squared
					std::shared_ptr<Pin> selection = nullptr;
					for (auto &pin : m_board->Pins()) {
						if (BoardElementIsVisible(pin)) {
							float dx   = pin->position.x - pos.x;
							float dy   = pin->position.y - pos.y;
							float dist = dx * dx + dy * dy;
							if ((dist < (pin->diameter * pin->diameter)) && (dist < min_dist)) {
								selection = pin;
								min_dist  = dist;
							}
						}
					}

					m_pinSelected = selection;
					if (m_pinSelected) {
						if (!io.KeyCtrl) {
							for (auto p : m_board->Components()) {
								p->visualmode = p->CVMNormal;
							}
							m_partHighlighted.resize(0);
							m_pinHighlighted.resize(0);
						}
						m_pinSelected->component->visualmode = m_pinSelected->component->CVMSelected;
						m_partHighlighted.push_back(m_pinSelected->component);
					}

					if (m_pinSelected == nullptr) {
						bool any_hits = false;

						for (auto &part : m_board->Components()) {
							int hit = 0;
							//							auto p_part = part.get();

							if (!BoardElementIsVisible(part)) continue;

							// Work out if the point is inside the hull
							{
								auto poly = part->outline;

								for (size_t i = 0, j = poly.size() - 1; i < poly.size(); j = i++) {
									if (((poly[i].y > pos.y) != (poly[j].y > pos.y)) &&
									    (pos.x <
									     (poly[j].x - poly[i].x) * (pos.y - poly[i].y) / (poly[j].y - poly[i].y) + poly[i].x))
										hit ^= 1;
								}
							}

							if (hit) {
								any_hits = true;

								bool partInList = contains(part, m_partHighlighted);

								/*
								 * If the CTRL key isn't held down, then we have to
								 * flush any existing highlighted parts
								 */
								if (io.KeyCtrl) {
									if (!partInList) {
										m_partHighlighted.push_back(part);
										part->visualmode = part->CVMSelected;
									} else {
										remove(part, m_partHighlighted);
										part->visualmode = part->CVMNormal;
									}

								} else {
									for (auto p : m_board->Components()) {
										p->visualmode = p->CVMNormal;
									}
									m_partHighlighted.resize(0);
									m_pinHighlighted.resize(0);
									if (!partInList) {
										m_partHighlighted.push_back(part);
										part->visualmode = part->CVMSelected;
									}
								}

								/*
								 * If this part has a non-selected visual mode (normal)
								 * AND it's not in the existing part list, then add it
								 */
								/*
								if (part->visualmode == part->CVMNormal) {
								    if (!partInList) {
								        m_partHighlighted.push_back(p_part);
								    }
								}

								part->visualmode++;
								part->visualmode %= part->CVMModeCount;

								if (part->visualmode == part->CVMNormal) {
								    remove(*part, m_partHighlighted);
								}
								*/
							} // if hit
						}     // for each part on the board

						/*
						 * If we aren't holding down CTRL and we click to a
						 * non pin, non part area, then we clear everything
						 */
						if ((!any_hits) && (!io.KeyCtrl)) {
							for (auto &part : m_board->Components()) {
								//								auto p        = part.get();
								part->visualmode = part->CVMNormal;
							}
							m_partHighlighted.clear();
						}

					} // if a pin wasn't selected

				} else {
					if (!m_showContextMenu) {
						if (AnnotationIsHovered()) {
							m_needsRedraw        = true;
							AnnotationWasHovered = true;
						} else {
							AnnotationWasHovered = false;
							m_needsRedraw        = true;
						}
					}
				}

				m_draggingLastFrame = false;
			}

			// Zoom:
			float mwheel = io.MouseWheel;
			if (mwheel != 0.0f) {
				mwheel *= config.zoomFactor;

				Zoom(io.MousePos.x, io.MousePos.y, mwheel);
			}
		}
	}

	if ((!io.WantCaptureKeyboard)) {

		if (keybindings.isPressed("Mirror")) {
			Mirror();
			CenterView();
			m_needsRedraw = true;

		} else if (keybindings.isPressed("RotateCW")) {
			// Rotate board: R and period rotate clockwise; comma rotates
			// counter-clockwise
			Rotate(1);

		} else if (keybindings.isPressed("RotateCCW")) {
			Rotate(-1);

		} else if (keybindings.isPressed("ZoomIn")) {
			Zoom(m_board_surface.x / 2, m_board_surface.y / 2, config.zoomFactor);

		} else if (keybindings.isPressed("ZoomOut")) {
			Zoom(m_board_surface.x / 2, m_board_surface.y / 2, -config.zoomFactor);

		} else if (keybindings.isPressed("PanDown")) {
			Pan(DIR_DOWN, DPI(config.panFactor));

		} else if (keybindings.isPressed("PanUp")) {
			Pan(DIR_UP, DPI(config.panFactor));

		} else if (keybindings.isPressed("PanLeft")) {
			Pan(DIR_LEFT, DPI(config.panFactor));

		} else if (keybindings.isPressed("PanRight")) {
			Pan(DIR_RIGHT, DPI(config.panFactor));

		} else if (keybindings.isPressed("Center")) {
			// Center and reset zoom
			CenterView();

		} else if (keybindings.isPressed("Quit")) {
			// quit OFBV
			m_wantsQuit = true;

		} else if (keybindings.isPressed("InfoPanel")) {
			config.showInfoPanel = !config.showInfoPanel;
			obvconfig.WriteBool("showInfoPanel", config.showInfoPanel ? true : false);

		} else if (keybindings.isPressed("NetList")) {
			// Show Net List
			m_showNetList = m_showNetList ? false : true;

		} else if (keybindings.isPressed("PartList")) {
			// Show Part List
			m_showPartList = m_showPartList ? false : true;

		} else if (keybindings.isPressed("Flip")) {
			// Flip board:
			FlipBoard();

		} else if (keybindings.isPressed("TogglePins")) {
			config.showPins ^= 1;
			m_needsRedraw = true;

		} else if (keybindings.isPressed("Search")) {
			if (m_validBoard) {
				m_showSearch  = true;
				m_needsRedraw = true;
			}

		} else if (keybindings.isPressed("Clear")) {
			ClearAllHighlights();

		} else {
			/*
			 * Do what ever is required for unhandled key presses.
			 */
		}
	}
}